

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseConnectDefBoxes(Ver_Man_t *pMan)

{
  ulong uVar1;
  uint uVar2;
  void *pvVar3;
  Abc_Obj_t *pObj;
  void *pvVar4;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *__ptr;
  long lVar5;
  long *plVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  size_t sVar14;
  Abc_Obj_t *pAVar15;
  Abc_Obj_t *pAVar16;
  char *pcVar17;
  Vec_Ptr_t *pVVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  Abc_Des_t *pAVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  Abc_Ntk_t *pAVar28;
  uint local_474;
  char local_418 [1000];
  
  pAVar24 = pMan->pDesign;
  pVVar18 = pAVar24->vModules;
  if (pVVar18->nSize < 1) {
    iVar10 = 1;
  }
  else {
    iVar10 = 1;
    lVar26 = 0;
    do {
      pvVar3 = pVVar18->pArray[lVar26];
      lVar23 = *(long *)((long)pvVar3 + 0x50);
      if (0 < *(int *)(lVar23 + 4)) {
        lVar27 = 0;
        do {
          pObj = *(Abc_Obj_t **)(*(long *)(lVar23 + 8) + lVar27 * 8);
          uVar19 = *(uint *)&pObj->field_0x14 & 0xf;
          if ((uVar19 != 8) && (pvVar4 = (pObj->field_5).pData, pvVar4 != (void *)0x0)) {
            lVar23 = *(long *)((long)pvVar4 + 8);
            if (lVar23 == 0) {
              __assert_fail("pNtkBox->pName",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                            ,0x4d,"int Ver_NtkIsDefined(Abc_Ntk_t *)");
            }
            lVar21 = *(long *)((long)pvVar4 + 0x28);
            iVar12 = *(int *)(lVar21 + 4);
            if ((iVar12 == 0) && (*(int *)(*(long *)((long)pvVar4 + 0x30) + 4) == 0)) {
              iVar10 = 2;
            }
            else {
              if (uVar19 != 10 && (*(uint *)&pObj->field_0x14 & 0xe) != 8) {
                __assert_fail("Abc_ObjIsBox(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                              ,0x4e,"int Ver_ObjIsConnected(Abc_Obj_t *)");
              }
              if (((pObj->vFanins).nSize != 0) || ((pObj->vFanouts).nSize != 0)) {
                __assert_fail("!Ver_ObjIsConnected(pBox)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                              ,0x821,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
              }
              pNtk = pObj->pNtk;
              __ptr = (pObj->field_6).pCopy;
              if ((iVar12 == 0) && (*(int *)(*(long *)((long)pvVar4 + 0x30) + 4) == 0)) {
                __assert_fail("Ver_NtkIsDefined(pNtkBox)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                              ,0x822,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
              }
              if ((*(int *)((long)pvVar4 + 4) == 6) &&
                 (*(int *)(*(long *)((long)pvVar4 + 0x50) + 4) != 1)) {
                __assert_fail("!Abc_NtkHasBlackbox(pNtkBox) || Abc_NtkBoxNum(pNtkBox) == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                              ,0x823,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
              }
              uVar19 = *(uint *)((long)&__ptr->pNtk + 4);
              lVar20 = *(long *)((long)pvVar4 + 0x30);
              iVar11 = *(int *)(lVar20 + 4);
              if (iVar11 + iVar12 < (int)uVar19) {
                pcVar13 = Abc_ObjName(pObj);
                sprintf(pMan->sError,
                        "The number of actual IOs (%d) is bigger than the number of formal IOs (%d) when instantiating network %s in box %s."
                        ,(ulong)uVar19,(ulong)(uint)(iVar11 + iVar12),lVar23,pcVar13);
                if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                  lVar26 = 0;
                  do {
                    Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar26]);
                    lVar26 = lVar26 + 1;
                  } while (lVar26 < *(int *)((long)&__ptr->pNtk + 4));
                }
LAB_002ec0a7:
                if (__ptr->pNext != (Abc_Obj_t *)0x0) {
                  free(__ptr->pNext);
                }
                free(__ptr);
                (pObj->field_6).pTemp = (void *)0x0;
LAB_002ec0ca:
                Ver_ParsePrintErrorMessage(pMan);
                return 0;
              }
              if (0 < (int)uVar19) {
                uVar25 = 0;
LAB_002eb8fb:
                pAVar28 = (&__ptr->pNext->pNtk)[uVar25];
                lVar5._0_4_ = pAVar28->ntkType;
                lVar5._4_4_ = pAVar28->ntkFunc;
                if (lVar5 != 0) goto code_r0x002eb909;
                pcVar13 = Abc_ObjName(pObj);
                uVar22 = 0;
                printf("Warning: The instance %s of network %s will be connected without using formal names.\n"
                       ,lVar23,pcVar13);
                uVar19 = *(uint *)((long)&__ptr->pNtk + 4);
                if (0 < (long)(int)uVar19) {
                  lVar23 = 0;
                  uVar22 = 0;
                  do {
                    uVar22 = uVar22 + *(int *)((&__ptr->pNext->pNtk)[lVar23]->pName + 4);
                    lVar23 = lVar23 + 1;
                  } while ((int)uVar19 != lVar23);
                }
                lVar23 = *(long *)((long)pvVar4 + 0x28);
                lVar21 = *(long *)((long)pvVar4 + 0x30);
                iVar12 = *(int *)(lVar21 + 4);
                uVar2 = iVar12 + *(int *)(lVar23 + 4);
                if (uVar22 != uVar2) {
                  uVar7 = *(undefined8 *)((long)pvVar4 + 8);
                  pcVar13 = Abc_ObjName(pObj);
                  sprintf(pMan->sError,
                          "The number of actual IOs (%d) is different from the number of formal IOs (%d) when instantiating network %s in box %s."
                          ,(ulong)uVar19,(ulong)uVar2,uVar7,pcVar13);
                  if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                    lVar26 = 0;
                    do {
                      Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar26]);
                      lVar26 = lVar26 + 1;
                    } while (lVar26 < *(int *)((long)&__ptr->pNtk + 4));
                  }
                  goto LAB_002ec0a7;
                }
                uVar25 = 0;
                if (0 < *(int *)(lVar23 + 4)) {
                  iVar12 = 0;
                  do {
                    if ((iVar12 < 0) || ((long)*(int *)((long)&__ptr->pNtk + 4) <= (long)uVar25))
                    goto LAB_002ec19f;
                    pAVar28 = (&__ptr->pNext->pNtk)[uVar25];
                    iVar11 = *(int *)(pAVar28->pName + 4);
                    if (0 < (long)iVar11) {
                      iVar12 = iVar12 + iVar11;
                      lVar23 = (long)iVar11;
                      do {
                        pcVar13 = pAVar28->pName;
                        if (*(int *)(pcVar13 + 4) < lVar23) goto LAB_002ec19f;
                        pAVar16 = *(Abc_Obj_t **)(*(long *)(pcVar13 + 8) + -8 + lVar23 * 8);
                        pAVar15 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
                        Abc_ObjAddFanin(pObj,pAVar15);
                        Abc_ObjAddFanin(pAVar15,pAVar16);
                        bVar9 = 1 < lVar23;
                        lVar23 = lVar23 + -1;
                      } while (bVar9);
                      lVar23 = *(long *)((long)pvVar4 + 0x28);
                    }
                    uVar25 = uVar25 + 1;
                  } while (iVar12 < *(int *)(lVar23 + 4));
                  lVar21 = *(long *)((long)pvVar4 + 0x30);
                  iVar12 = *(int *)(lVar21 + 4);
                  uVar25 = uVar25 & 0xffffffff;
                }
                if (0 < iVar12) {
                  iVar12 = 0;
                  do {
                    if ((iVar12 < 0) || (*(int *)((long)&__ptr->pNtk + 4) <= (int)uVar25))
                    goto LAB_002ec19f;
                    pAVar28 = (&__ptr->pNext->pNtk)[uVar25];
                    iVar11 = *(int *)(pAVar28->pName + 4);
                    if (0 < (long)iVar11) {
                      iVar12 = iVar12 + iVar11;
                      lVar23 = (long)iVar11;
                      do {
                        pcVar13 = pAVar28->pName;
                        if (*(int *)(pcVar13 + 4) < lVar23) goto LAB_002ec19f;
                        pAVar16 = *(Abc_Obj_t **)(*(long *)(pcVar13 + 8) + -8 + lVar23 * 8);
                        pAVar15 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
                        Abc_ObjAddFanin(pAVar15,pObj);
                        Abc_ObjAddFanin(pAVar16,pAVar15);
                        bVar9 = 1 < lVar23;
                        lVar23 = lVar23 + -1;
                      } while (bVar9);
                      lVar21 = *(long *)((long)pvVar4 + 0x30);
                    }
                    uVar25 = uVar25 + 1;
                  } while (iVar12 < *(int *)(lVar21 + 4));
                }
                if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                  lVar23 = 0;
                  do {
                    Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar23]);
                    lVar23 = lVar23 + 1;
                  } while (lVar23 < *(int *)((long)&__ptr->pNtk + 4));
                }
                pAVar16 = __ptr->pNext;
                goto joined_r0x002ebf01;
              }
LAB_002eb911:
              if (0 < iVar12) {
                uVar25 = 0;
                do {
                  local_474 = (uint)uVar25;
                  if ((int)local_474 < 0) goto LAB_002ec19f;
                  plVar6 = *(long **)(*(long *)(lVar21 + 8) + uVar25 * 8);
                  pcVar13 = Abc_ObjName(*(Abc_Obj_t **)
                                         (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                         (long)*(int *)plVar6[6] * 8));
                  iVar12 = *(int *)((long)&__ptr->pNtk + 4);
                  lVar23 = (long)iVar12;
                  if (lVar23 < 1) {
                    __assert_fail("pBundle != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                                  ,0x885,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
                  }
                  pAVar16 = __ptr->pNext;
                  lVar21 = 0;
                  do {
                    pAVar28 = (&pAVar16->pNtk)[lVar21];
                    iVar11 = strcmp(*(char **)pAVar28,pcVar13);
                    if (iVar11 == 0) {
                      if (iVar12 != (int)lVar21) goto LAB_002eba38;
                      break;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar23 != lVar21);
                  sVar14 = strlen(pcVar13);
                  if (pcVar13[(long)((sVar14 << 0x20) + -0x100000000) >> 0x20] != ']') {
LAB_002ebfee:
                    uVar7 = *(undefined8 *)((long)pvVar4 + 8);
                    pcVar17 = Abc_ObjName(pObj);
                    sprintf(pMan->sError,
                            "Cannot find an actual net for the formal net %s when instantiating network %s in box %s."
                            ,pcVar13,uVar7,pcVar17);
                    goto LAB_002ec0ca;
                  }
                  uVar25 = sVar14 & 0xffffffff;
                  do {
                    if ((int)uVar25 < 1) goto LAB_002ebfee;
                    uVar1 = uVar25 - 1;
                    lVar21 = uVar25 - 1;
                    uVar25 = uVar1;
                  } while (pcVar13[lVar21] != '[');
                  if (uVar1 == 0) goto LAB_002ebfee;
                  lVar21 = 0;
                  while( true ) {
                    pAVar28 = (&pAVar16->pNtk)[lVar21];
                    pcVar17 = *(char **)pAVar28;
                    iVar11 = strncmp(pcVar17,pcVar13,uVar1 & 0xffffffff);
                    if ((iVar11 == 0) && (sVar14 = strlen(pcVar17), (int)sVar14 == (int)uVar1))
                    break;
                    lVar21 = lVar21 + 1;
                    if (lVar23 == lVar21) goto LAB_002ebfee;
                  }
                  if (iVar12 == (int)lVar21) goto LAB_002ebfee;
LAB_002eba38:
                  iVar12 = *(int *)(pAVar28->pName + 4);
                  if (0 < (long)iVar12) {
                    local_474 = local_474 + iVar12;
                    lVar23 = (long)iVar12;
                    do {
                      if (*(int *)(pAVar28->pName + 4) < lVar23) goto LAB_002ec19f;
                      pAVar16 = *(Abc_Obj_t **)(*(long *)(pAVar28->pName + 8) + -8 + lVar23 * 8);
                      pAVar15 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
                      Abc_ObjAddFanin(pObj,pAVar15);
                      Abc_ObjAddFanin(pAVar15,pAVar16);
                      bVar9 = 1 < lVar23;
                      lVar23 = lVar23 + -1;
                    } while (bVar9);
                  }
                  uVar25 = (ulong)local_474;
                  lVar21 = *(long *)((long)pvVar4 + 0x28);
                } while ((int)local_474 < *(int *)(lVar21 + 4));
                lVar20 = *(long *)((long)pvVar4 + 0x30);
                iVar11 = *(int *)(lVar20 + 4);
              }
              if (0 < iVar11) {
                uVar19 = 0;
LAB_002ebacd:
                if ((int)uVar19 < 0) {
LAB_002ec19f:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                plVar6 = *(long **)(*(long *)(lVar20 + 8) + (ulong)uVar19 * 8);
                pcVar13 = Abc_ObjName(*(Abc_Obj_t **)
                                       (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                       (long)*(int *)plVar6[4] * 8));
                iVar12 = *(int *)((long)&__ptr->pNtk + 4);
                lVar23 = (long)iVar12;
                if (lVar23 < 1) {
                  __assert_fail("pBundle != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                                ,0x8b8,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
                }
                pAVar16 = __ptr->pNext;
                lVar21 = 0;
                do {
                  pAVar28 = (&pAVar16->pNtk)[lVar21];
                  iVar11 = strcmp(*(char **)pAVar28,pcVar13);
                  if (iVar11 == 0) {
                    if (iVar12 != (int)lVar21) goto LAB_002ebc52;
                    break;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar23 != lVar21);
                sVar14 = strlen(pcVar13);
                if (pcVar13[(long)((sVar14 << 0x20) + -0x100000000) >> 0x20] == ']') {
                  uVar25 = sVar14 & 0xffffffff;
                  do {
                    if ((int)uVar25 < 1) goto LAB_002ebbd4;
                    uVar1 = uVar25 - 1;
                    lVar21 = uVar25 - 1;
                    uVar25 = uVar1;
                  } while (pcVar13[lVar21] != '[');
                  if (uVar1 != 0) {
                    lVar21 = 0;
                    do {
                      pAVar28 = (&pAVar16->pNtk)[lVar21];
                      pcVar17 = *(char **)pAVar28;
                      iVar11 = strncmp(pcVar17,pcVar13,uVar1 & 0xffffffff);
                      if ((iVar11 == 0) && (sVar14 = strlen(pcVar17), (int)sVar14 == (int)uVar1)) {
                        if (iVar12 != (int)lVar21) goto LAB_002ebc52;
                        break;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar23 != lVar21);
                  }
                }
LAB_002ebbd4:
                pAVar16 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
                sprintf(local_418,"_temp_net%d",(ulong)(uint)pAVar16->Id);
                pAVar15 = Abc_NtkFindOrCreateNet(pNtk,local_418);
                Abc_ObjAddFanin(pAVar16,pObj);
                Abc_ObjAddFanin(pAVar15,pAVar16);
                uVar19 = uVar19 + 1;
                goto LAB_002ebc31;
              }
LAB_002ebf94:
              if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                lVar23 = 0;
                do {
                  Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar23]);
                  lVar23 = lVar23 + 1;
                } while (lVar23 < *(int *)((long)&__ptr->pNtk + 4));
              }
              pAVar16 = __ptr->pNext;
joined_r0x002ebf01:
              if (pAVar16 != (Abc_Obj_t *)0x0) {
                free(pAVar16);
              }
              free(__ptr);
              (pObj->field_6).pTemp = (void *)0x0;
              if (*(int *)((long)(pObj->field_5).pData + 4) != 6) {
                if ((*(uint *)&pObj->field_0x14 & 0xf) != 10) {
                  __assert_fail("Abc_ObjIsBlackbox(pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                                ,0x16a,"void Abc_ObjBlackboxToWhitebox(Abc_Obj_t *)");
                }
                *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfffffff0 | 9;
                uVar7 = *(undefined8 *)(pObj->pNtk->nObjCounts + 9);
                *(ulong *)(pObj->pNtk->nObjCounts + 9) =
                     CONCAT44((int)((ulong)uVar7 >> 0x20) + -1,(int)uVar7 + 1);
              }
            }
          }
          lVar27 = lVar27 + 1;
          lVar23 = *(long *)((long)pvVar3 + 0x50);
        } while (lVar27 < *(int *)(lVar23 + 4));
        pAVar24 = pMan->pDesign;
      }
      lVar26 = lVar26 + 1;
      pVVar18 = pAVar24->vModules;
    } while (lVar26 < pVVar18->nSize);
  }
  return iVar10;
code_r0x002eb909:
  uVar25 = uVar25 + 1;
  if (uVar19 == uVar25) goto LAB_002eb911;
  goto LAB_002eb8fb;
LAB_002ebc52:
  iVar12 = *(int *)(pAVar28->pName + 4);
  if (0 < (long)iVar12) {
    uVar19 = uVar19 + iVar12;
    uVar25 = (long)iVar12;
    do {
      if ((long)*(int *)(pAVar28->pName + 4) < (long)uVar25) goto LAB_002ec19f;
      pAVar16 = *(Abc_Obj_t **)(*(long *)(pAVar28->pName + 8) + -8 + uVar25 * 8);
      pcVar13 = Abc_ObjName(pAVar16);
      iVar12 = strcmp(pcVar13,"1\'b0");
      if (iVar12 == 0) {
LAB_002ec036:
        uVar7._0_4_ = pAVar28->ntkType;
        uVar7._4_4_ = pAVar28->ntkFunc;
        pcVar13 = Abc_ObjName(pAVar16);
        uVar8 = *(undefined8 *)((long)pvVar4 + 8);
        pcVar17 = Abc_ObjName(pObj);
        sprintf(pMan->sError,
                "It looks like formal output %s is driving a constant net (%s) when instantiating network %s in box %s."
                ,uVar7,pcVar13,uVar8,pcVar17);
        if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
          lVar26 = 0;
          do {
            Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar26]);
            lVar26 = lVar26 + 1;
          } while (lVar26 < *(int *)((long)&__ptr->pNtk + 4));
        }
        goto LAB_002ec0a7;
      }
      pcVar13 = Abc_ObjName(pAVar16);
      iVar12 = strcmp(pcVar13,"1\'b1");
      if (iVar12 == 0) goto LAB_002ec036;
      pAVar15 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
      Abc_ObjAddFanin(pAVar15,pObj);
      Abc_ObjAddFanin(pAVar16,pAVar15);
      bVar9 = 1 < uVar25;
      uVar25 = uVar25 - 1;
    } while (bVar9);
  }
LAB_002ebc31:
  lVar20 = *(long *)((long)pvVar4 + 0x30);
  if (*(int *)(lVar20 + 4) <= (int)uVar19) goto LAB_002ebf94;
  goto LAB_002ebacd;
}

Assistant:

int Ver_ParseConnectDefBoxes( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, RetValue = 1;
    // go through all the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        // go through all the boxes of this module
        Abc_NtkForEachBox( pNtk, pBox, k )
        {
            if ( Abc_ObjIsLatch(pBox) )
                continue;
            // skip internal boxes of the blackboxes
            if ( pBox->pData == NULL )
                continue;
            // if the network is undefined, it will be connected later
            if ( !Ver_NtkIsDefined((Abc_Ntk_t *)pBox->pData) )
            {
                RetValue = 2;
                continue;
            }
            // connect the box
            if ( !Ver_ParseConnectBox( pMan, pBox ) )
                return 0;
            // if the network is a true blackbox, skip
            if ( Abc_NtkHasBlackbox((Abc_Ntk_t *)pBox->pData) )
                continue;
            // convert the box to the whitebox
            Abc_ObjBlackboxToWhitebox( pBox );
        }
    }
    return RetValue;
}